

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O0

char * uloc_kw_nextKeyword(UEnumeration *en,int32_t *resultLength,UErrorCode *param_3)

{
  size_t sVar1;
  int local_2c;
  char *pcStack_28;
  int32_t len;
  char *result;
  UErrorCode *param_2_local;
  int32_t *resultLength_local;
  UEnumeration *en_local;
  
  pcStack_28 = *(char **)((long)en->context + 8);
  local_2c = 0;
  if (*pcStack_28 == '\0') {
    pcStack_28 = (char *)0x0;
  }
  else {
    sVar1 = strlen(*(char **)((long)en->context + 8));
    local_2c = (int)sVar1;
    *(long *)((long)en->context + 8) = *(long *)((long)en->context + 8) + (long)(local_2c + 1);
  }
  if (resultLength != (int32_t *)0x0) {
    *resultLength = local_2c;
  }
  return pcStack_28;
}

Assistant:

static const char * U_CALLCONV
uloc_kw_nextKeyword(UEnumeration* en,
                    int32_t* resultLength,
                    UErrorCode* /*status*/) {
    const char* result = ((UKeywordsContext *)en->context)->current;
    int32_t len = 0;
    if(*result) {
        len = (int32_t)uprv_strlen(((UKeywordsContext *)en->context)->current);
        ((UKeywordsContext *)en->context)->current += len+1;
    } else {
        result = NULL;
    }
    if (resultLength) {
        *resultLength = len;
    }
    return result;
}